

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::InternalException::InternalException<std::__cxx11::string>
          (InternalException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  string *in_RDX;
  InternalException *in_RDI;
  string local_58 [32];
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(local_58,in_RDX);
  Exception::ConstructMessage<std::__cxx11::string>((string *)in_RDX,in_stack_ffffffffffffffe0);
  duckdb::InternalException::InternalException(in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}